

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometryVertexBuffer
          (OgreBinarySerializer *this,VertexData *dest)

{
  uint16_t source;
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  MemoryIOStream *__p;
  __shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2> *this_00;
  Logger *this_01;
  DeadlyImportError *pDVar5;
  ulong numBytes;
  uint16_t bindIndex;
  char *local_1b8 [4];
  undefined1 local_198 [376];
  
  source = Read<unsigned_short>(this);
  bindIndex = source;
  uVar1 = Read<unsigned_short>(this);
  uVar2 = ReadHeader(this,true);
  if (uVar2 != 0x5210) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,
               "M_GEOMETRY_VERTEX_BUFFER_DATA not found in M_GEOMETRY_VERTEX_BUFFER",
               (allocator<char> *)local_1b8);
    DeadlyImportError::DeadlyImportError(pDVar5,(string *)local_198);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = VertexData::VertexSize(dest,source);
  if (uVar3 == uVar1) {
    numBytes = (ulong)(uVar3 * (dest->super_IVertexData).count);
    puVar4 = ReadBytes(this,numBytes);
    __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
    (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_0080bab0;
    __p->buffer = puVar4;
    __p->length = numBytes;
    __p->pos = 0;
    __p->own = true;
    std::__shared_ptr<Assimp::MemoryIOStream,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Assimp::MemoryIOStream,void>
              ((__shared_ptr<Assimp::MemoryIOStream,(__gnu_cxx::_Lock_policy)2> *)local_198,__p);
    this_00 = &std::
               map<unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
               ::operator[](&dest->vertexBindings,&bindIndex)->
               super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,(__shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2> *)local_198
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8));
    this_01 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[37]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
               (char (*) [37])"    - Read vertex buffer for source ");
    std::ostream::operator<<
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
               bindIndex);
    std::operator<<((ostream *)local_198," of ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::operator<<((ostream *)local_198," bytes");
    std::__cxx11::stringbuf::str();
    Logger::debug(this_01,local_1b8[0]);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    return;
  }
  pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,
             "Vertex buffer size does not agree with vertex declaration in M_GEOMETRY_VERTEX_BUFFER"
             ,(allocator<char> *)local_1b8);
  DeadlyImportError::DeadlyImportError(pDVar5,(string *)local_198);
  __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadGeometryVertexBuffer(VertexData *dest)
{
    uint16_t bindIndex = Read<uint16_t>();
    uint16_t vertexSize = Read<uint16_t>();

    uint16_t id = ReadHeader();
    if (id != M_GEOMETRY_VERTEX_BUFFER_DATA)
        throw DeadlyImportError("M_GEOMETRY_VERTEX_BUFFER_DATA not found in M_GEOMETRY_VERTEX_BUFFER");

    if (dest->VertexSize(bindIndex) != vertexSize)
        throw DeadlyImportError("Vertex buffer size does not agree with vertex declaration in M_GEOMETRY_VERTEX_BUFFER");

    size_t numBytes = dest->count * vertexSize;
    uint8_t *vertexBuffer = ReadBytes(numBytes);
    dest->vertexBindings[bindIndex] = MemoryStreamPtr(new Assimp::MemoryIOStream(vertexBuffer, numBytes, true));

    ASSIMP_LOG_DEBUG_F( "    - Read vertex buffer for source ", bindIndex, " of ", numBytes, " bytes");
}